

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

string * __thiscall smf::Options::getArg_abi_cxx11_(Options *this,int index)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  int index_local;
  Options *this_local;
  
  if (-1 < index) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_argument);
    if (index < (int)sVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_argument,(long)index);
      return pvVar3;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Error: m_argument ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,index);
  poVar2 = std::operator<<(poVar2," does not exist.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

const std::string& Options::getArg(int index) {
   if (index < 0 || index >= (int)m_argument.size()) {
      std::cerr << "Error: m_argument " << index << " does not exist." << std::endl;
      exit(1);
   }
   return m_argument[index];
}